

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.hpp
# Opt level: O3

void __thiscall
gl4cts::TextureFilterMinmaxUtils::SupportedTextureType::~SupportedTextureType
          (SupportedTextureType *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_SupportedTextureType = (_func_int **)&PTR___cxa_pure_virtual_020e0588;
  pcVar1 = (this->m_fragmentShader)._M_dataplus._M_p;
  paVar2 = &(this->m_fragmentShader).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_vertexShader)._M_dataplus._M_p;
  paVar2 = &(this->m_vertexShader).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~SupportedTextureType(){}